

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O0

uint borg_guess_race_name(char *who)

{
  wchar_t wVar1;
  _Bool _Var2;
  wchar_t wVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  int local_f4;
  char local_e8 [4];
  wchar_t len;
  char partial [160];
  monster_race *r_ptr;
  wchar_t b_s;
  wchar_t s;
  wchar_t b_i;
  wchar_t i;
  wchar_t n;
  wchar_t m;
  wchar_t k;
  char *who_local;
  
  b_s = L'\0';
  r_ptr._4_4_ = 0;
  sVar5 = strlen(who);
  i = L'\0';
  b_i = borg_unique_size;
  wVar1 = b_i;
  while (b_i = wVar1, i < b_i + L'\xffffffff') {
    wVar3 = (i + b_i) / 2;
    iVar4 = strcmp(borg_unique_text[wVar3],who);
    wVar1 = wVar3;
    if (iVar4 < 1) {
      wVar1 = b_i;
      i = wVar3;
    }
  }
  iVar4 = strcmp(who,borg_unique_text[i]);
  if (iVar4 == 0) {
    who_local._4_4_ = borg_unique_what[i];
  }
  else {
    _Var2 = suffix(who," (offscreen)");
    _m = who;
    if (_Var2) {
      my_strcpy(local_e8,who,0xa0);
      local_e8[(int)sVar5 + -0xc] = '\0';
      _m = local_e8;
      pcVar6 = format("# Handling offscreen monster (%s)",_m);
      borg_note(pcVar6);
    }
    _Var2 = prefix(_m,"The ");
    if ((_Var2) || (_Var2 = prefix(_m,"the "), _Var2)) {
      _m = _m + 4;
      i = L'\0';
      b_i = borg_normal_size;
      wVar1 = b_i;
      while (b_i = wVar1, i < b_i + L'\xffffffff') {
        wVar3 = (i + b_i) / 2;
        iVar4 = strcmp(borg_normal_text[wVar3],_m);
        wVar1 = wVar3;
        if (iVar4 < 1) {
          wVar1 = b_i;
          i = wVar3;
        }
      }
      n = i;
      while ((L'\xffffffff' < n && (iVar4 = strcmp(_m,borg_normal_text[n]), iVar4 == 0))) {
        wVar1 = borg_normal_what[n];
        if (r_info[wVar1].level - borg.trait[0x69] < 0) {
          local_f4 = -(r_info[wVar1].level - borg.trait[0x69]);
        }
        else {
          local_f4 = r_info[wVar1].level - borg.trait[0x69];
        }
        local_f4 = 1000 - local_f4;
        if ((b_s != L'\0') && (local_f4 < r_ptr._4_4_)) {
          local_f4 = r_ptr._4_4_;
          wVar1 = b_s;
        }
        b_s = wVar1;
        r_ptr._4_4_ = local_f4;
        n = n + L'\xffffffff';
      }
      if (b_s == L'\0') {
        pcVar6 = format("# Assuming player ghost (%s)(b)",_m);
        borg_note(pcVar6);
        who_local._4_4_ = (uint)z_info->r_max + L'\xffffffff';
      }
      else {
        who_local._4_4_ = b_s;
      }
    }
    else {
      pcVar6 = format("# Assuming player ghost (%s) (a)",_m);
      borg_note(pcVar6);
      who_local._4_4_ = (uint)z_info->r_max + L'\xffffffff';
    }
  }
  return who_local._4_4_;
}

Assistant:

static unsigned int borg_guess_race_name(char *who)
{
    int k, m, n;

    int i, b_i = 0;
    int s, b_s = 0;

    struct monster_race *r_ptr;

    char partial[160];
    int  len = strlen(who);

    /* Start the search */
    m = 0;
    n = borg_unique_size;

    /* Binary search */
    while (m < n - 1) {
        /* Pick a "middle" entry */
        i = (m + n) / 2;

        /* Search to the right (or here) */
        if (strcmp(borg_unique_text[i], who) <= 0) {
            m = i;
        }

        /* Search to the left */
        else {
            n = i;
        }
    }

    /* Check for equality */
    if (streq(who, borg_unique_text[m])) {
        /* Use this monster */
        return (borg_unique_what[m]);
    }

    /* Hack -- handle "offscreen" */
    if (suffix(who, " (offscreen)")) {
        /* Remove the suffix */
        my_strcpy(partial, who, sizeof(partial));
        partial[len - 12] = '\0';
        who               = partial;

        /* Message */
        borg_note(format("# Handling offscreen monster (%s)", who));
    }

    /* Assume player ghost */
    if (!prefix(who, "The ") && !prefix(who, "the ")) {
        /* Message */
        borg_note(format("# Assuming player ghost (%s) (a)", who));

        /* Oops */
        return (z_info->r_max - 1);
    }

    /* Skip the prefix */
    who += 4;

    /* Start the search */
    m = 0;
    n = borg_normal_size;

    /* Binary search */
    while (m < n - 1) {
        /* Pick a "middle" entry */
        i = (m + n) / 2;

        /* Search to the right (or here) */
        if (strcmp(borg_normal_text[i], who) <= 0) {
            m = i;
        }

        /* Search to the left */
        else {
            n = i;
        }
    }

    /* Scan possibilities */
    for (k = m; k >= 0; k--) {
        /* Stop when done */
        if (!streq(who, borg_normal_text[k]))
            break;

        /* Extract the monster */
        i = (int)borg_normal_what[k];

        /* Access the monster */
        r_ptr = &r_info[i];

        /* Basic score */
        s = 1000;

        /* Penalize "depth miss" */
        s = s - ABS(r_ptr->level - borg.trait[BI_CDEPTH]);

        /* Track best */
        if (b_i && (s < b_s))
            continue;

        /* Track it */
        b_i = i;
        b_s = s;
    }

    /* Success */
    if (b_i)
        return ((unsigned int)b_i);

    /* No match found */
    borg_note(format("# Assuming player ghost (%s)(b)", who));

    /* Oops */
    return (z_info->r_max - 1);
}